

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_mul_mips64(float16 a,float16 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  bool bVar12;
  FloatParts FVar13;
  FloatParts FVar14;
  FloatParts p;
  
  FVar13._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar13.frac = (ulong)(a & 0x3ff);
  FVar13 = sf_canonicalize(FVar13,&float16_params,status);
  uVar10 = FVar13._8_8_;
  uVar1 = FVar13.frac;
  FVar14._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar14.frac = (ulong)(b & 0x3ff);
  FVar14 = sf_canonicalize(FVar14,&float16_params,status);
  uVar3 = FVar14._8_8_;
  uVar2 = FVar14.frac;
  uVar4 = (uVar3 ^ uVar10) & 0x10000000000;
  uVar5 = FVar13._12_4_ & 0xff;
  uVar6 = FVar14._12_4_ & 0xff;
  if ((uVar5 == 2) && (uVar6 == 2)) {
    uVar7 = (uVar1 & 0xffffffff) * (uVar2 >> 0x20);
    uVar8 = (ulong)(uint)FVar14.frac * (uVar1 >> 0x20);
    uVar9 = uVar8 + uVar7;
    uVar3 = uVar2 * uVar1;
    uVar2 = ((uVar9 >> 0x20) + (uVar2 >> 0x20) * (uVar1 >> 0x20) +
             ((ulong)CARRY8(uVar8,uVar7) << 0x20) + (ulong)(uVar3 < uVar9 << 0x20)) * 4;
    uVar7 = uVar2 | uVar3 >> 0x3e;
    bVar12 = (uVar3 & 0x3fffffffffffffff) != 0;
    uVar1 = (ulong)((uint)bVar12 | (uint)uVar7 & 1) | uVar7 >> 1;
    if (-1 < (long)uVar7) {
      uVar1 = bVar12 | uVar7;
    }
    uVar10 = uVar10 & 0xffff00ff00000000 |
             (ulong)(uint)((FVar14.exp + FVar13.exp) - (int)((long)uVar2 >> 0x3f));
  }
  else {
    if (((uVar10 | uVar3) & 0xfc00000000) != 0) {
      p = pick_nan(FVar13,FVar14,status);
      goto LAB_0086e755;
    }
    if (((uVar5 == 3) && (uVar6 == 1)) || ((uVar5 == 1 && (uVar6 == 3)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar11 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar11 = 0x1fffffffffffffff;
      }
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = uVar11;
      goto LAB_0086e755;
    }
    if ((uVar5 | 2) != 3) {
      if ((uVar6 | 2) != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar4 = uVar4 | uVar3 & 0xffff0003ffffffff;
      p.exp = (int)uVar4;
      p.cls = (char)(uVar4 >> 0x20);
      p.sign = (_Bool)(char)(uVar4 >> 0x28);
      p._14_2_ = (short)(uVar4 >> 0x30);
      p.frac = uVar2;
      goto LAB_0086e755;
    }
    uVar10 = uVar10 & 0xffff0003ffffffff;
  }
  uVar10 = uVar10 | uVar4;
  p.exp = (int)uVar10;
  p.cls = (char)(uVar10 >> 0x20);
  p.sign = (_Bool)(char)(uVar10 >> 0x28);
  p._14_2_ = (short)(uVar10 >> 0x30);
  p.frac = uVar1;
LAB_0086e755:
  FVar13 = round_canonical(p,status,&float16_params);
  return (ushort)FVar13.frac & 0x3ff | (ushort)((FVar13.exp & 0x1fU) << 10) |
         (ushort)(FVar13._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_mul(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = mul_floats(pa, pb, status);

    return float16_round_pack_canonical(pr, status);
}